

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O3

int vs_end(bitstream *str)

{
  int iVar1;
  uint32_t one;
  uint32_t local_c;
  
  local_c = 1;
  if (str->type != VS_H264) {
    if (str->type != VS_H262) {
      abort();
    }
LAB_00104aad:
    iVar1 = vs_align_byte(str,VS_ALIGN_0);
    return iVar1;
  }
  iVar1 = vs_u(str,&local_c,1);
  if (iVar1 == 0) {
    if (local_c == 1) goto LAB_00104aad;
    vs_end_cold_1();
  }
  return 1;
}

Assistant:

int vs_end(struct bitstream *str) {
	uint32_t one = 1;
	switch (str->type) {
		case VS_H262:
			return vs_align_byte(str, VS_ALIGN_0);
		case VS_H264:
			if (vs_u(str, &one, 1))
				return 1;
			if (one != 1) {
				fprintf (stderr, "Wrong RBSP trailing bit!\n");
				return 1;
			}
			return vs_align_byte(str, VS_ALIGN_0);
			/* XXX: add the cabac special case */
		default:
			abort();
	}
}